

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

void arkStep_Free(ARKodeMem ark_mem)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  sunindextype Blrw;
  sunindextype Bliw;
  long local_30;
  long local_28;
  
  if ((ark_mem != (ARKodeMem)0x0) && (pvVar1 = ark_mem->step_mem, pvVar1 != (void *)0x0)) {
    if (*(ARKodeButcherTable *)((long)pvVar1 + 0x70) != (ARKodeButcherTable)0x0) {
      ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)pvVar1 + 0x70),&local_28,&local_30);
      ARKodeButcherTable_Free(*(ARKodeButcherTable *)((long)pvVar1 + 0x70));
      *(undefined8 *)((long)pvVar1 + 0x70) = 0;
      ark_mem->liw = ark_mem->liw - local_28;
      ark_mem->lrw = ark_mem->lrw - local_30;
    }
    if (*(ARKodeButcherTable *)((long)pvVar1 + 0x78) != (ARKodeButcherTable)0x0) {
      ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)pvVar1 + 0x78),&local_28,&local_30);
      ARKodeButcherTable_Free(*(ARKodeButcherTable *)((long)pvVar1 + 0x78));
      *(undefined8 *)((long)pvVar1 + 0x78) = 0;
      ark_mem->liw = ark_mem->liw - local_28;
      ark_mem->lrw = ark_mem->lrw - local_30;
    }
    if ((*(long *)((long)pvVar1 + 0x88) != 0) && (*(int *)((long)pvVar1 + 0x90) != 0)) {
      SUNNonlinSolFree();
      *(undefined4 *)((long)pvVar1 + 0x90) = 0;
    }
    *(undefined8 *)((long)pvVar1 + 0x88) = 0;
    if (*(code **)((long)pvVar1 + 0x138) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x138))(ark_mem);
      *(undefined8 *)((long)pvVar1 + 0x140) = 0;
    }
    if (*(code **)((long)pvVar1 + 0x170) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x170))(ark_mem);
      *(undefined8 *)((long)pvVar1 + 0x178) = 0;
    }
    if (*(long *)((long)pvVar1 + 0x48) != 0) {
      arkFreeVec(ark_mem,(N_Vector *)((long)pvVar1 + 0x48));
      *(N_Vector *)((long)pvVar1 + 0x48) = (N_Vector)0x0;
    }
    if (*(long *)((long)pvVar1 + 0x50) != 0) {
      arkFreeVec(ark_mem,(N_Vector *)((long)pvVar1 + 0x50));
      *(N_Vector *)((long)pvVar1 + 0x50) = (N_Vector)0x0;
    }
    if (*(long *)((long)pvVar1 + 0x58) != 0) {
      arkFreeVec(ark_mem,(N_Vector *)((long)pvVar1 + 0x58));
      *(N_Vector *)((long)pvVar1 + 0x58) = (N_Vector)0x0;
    }
    if (*(long *)((long)pvVar1 + 0x30) != 0) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < *(int *)((long)pvVar1 + 0x6c); lVar3 = lVar3 + 1) {
        arkFreeVec(ark_mem,(N_Vector *)((long)*(void **)((long)pvVar1 + 0x30) + lVar2));
        lVar2 = lVar2 + 8;
      }
      free(*(void **)((long)pvVar1 + 0x30));
      *(undefined8 *)((long)pvVar1 + 0x30) = 0;
      ark_mem->liw = ark_mem->liw - (long)*(int *)((long)pvVar1 + 0x6c);
    }
    if (*(long *)((long)pvVar1 + 0x38) != 0) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < *(int *)((long)pvVar1 + 0x6c); lVar3 = lVar3 + 1) {
        arkFreeVec(ark_mem,(N_Vector *)((long)*(void **)((long)pvVar1 + 0x38) + lVar2));
        lVar2 = lVar2 + 8;
      }
      free(*(void **)((long)pvVar1 + 0x38));
      *(undefined8 *)((long)pvVar1 + 0x38) = 0;
      ark_mem->liw = ark_mem->liw - (long)*(int *)((long)pvVar1 + 0x6c);
    }
    if (*(long *)((long)pvVar1 + 0x40) != 0) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < *(int *)((long)pvVar1 + 0x6c); lVar3 = lVar3 + 1) {
        arkFreeVec(ark_mem,(N_Vector *)((long)*(void **)((long)pvVar1 + 0x40) + lVar2));
        lVar2 = lVar2 + 8;
      }
      free(*(void **)((long)pvVar1 + 0x40));
      *(undefined8 *)((long)pvVar1 + 0x40) = 0;
      ark_mem->liw = ark_mem->liw - (long)*(int *)((long)pvVar1 + 0x6c);
    }
    if (*(void **)((long)pvVar1 + 0x1b0) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1b0));
      *(undefined8 *)((long)pvVar1 + 0x1b0) = 0;
      ark_mem->lrw = ark_mem->lrw - (long)*(int *)((long)pvVar1 + 0x1c0);
    }
    if (*(void **)((long)pvVar1 + 0x1b8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1b8));
      *(undefined8 *)((long)pvVar1 + 0x1b8) = 0;
      ark_mem->liw = ark_mem->liw - (long)*(int *)((long)pvVar1 + 0x1c0);
    }
    *(undefined4 *)((long)pvVar1 + 0x1c0) = 0;
    if (*(void **)((long)pvVar1 + 0x1f0) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1f0));
      *(undefined8 *)((long)pvVar1 + 0x1f0) = 0;
      ark_mem->lrw = ark_mem->lrw - (long)*(int *)((long)pvVar1 + 0x6c);
    }
    if (*(void **)((long)pvVar1 + 0x1f8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 0x1f8));
      *(undefined8 *)((long)pvVar1 + 0x1f8) = 0;
      ark_mem->lrw = ark_mem->lrw - (long)*(int *)((long)pvVar1 + 0x6c);
    }
    free(ark_mem->step_mem);
    ark_mem->step_mem = (void *)0x0;
  }
  return;
}

Assistant:

void arkStep_Free(ARKodeMem ark_mem)
{
  int j;
  sunindextype Bliw, Blrw;
  ARKodeARKStepMem step_mem;

  /* nothing to do if ark_mem is already NULL */
  if (ark_mem == NULL) { return; }

  /* conditional frees on non-NULL ARKStep module */
  if (ark_mem->step_mem != NULL)
  {
    step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

    /* free the Butcher tables */
    if (step_mem->Be != NULL)
    {
      ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
      ARKodeButcherTable_Free(step_mem->Be);
      step_mem->Be = NULL;
      ark_mem->liw -= Bliw;
      ark_mem->lrw -= Blrw;
    }
    if (step_mem->Bi != NULL)
    {
      ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
      ARKodeButcherTable_Free(step_mem->Bi);
      step_mem->Bi = NULL;
      ark_mem->liw -= Bliw;
      ark_mem->lrw -= Blrw;
    }

    /* free the nonlinear solver memory (if applicable) */
    if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
    {
      SUNNonlinSolFree(step_mem->NLS);
      step_mem->ownNLS = SUNFALSE;
    }
    step_mem->NLS = NULL;

    /* free the linear solver memory */
    if (step_mem->lfree != NULL)
    {
      step_mem->lfree((void*)ark_mem);
      step_mem->lmem = NULL;
    }

    /* free the mass matrix solver memory */
    if (step_mem->mfree != NULL)
    {
      step_mem->mfree((void*)ark_mem);
      step_mem->mass_mem = NULL;
    }

    /* free the sdata, zpred and zcor vectors */
    if (step_mem->sdata != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->sdata);
      step_mem->sdata = NULL;
    }
    if (step_mem->zpred != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->zpred);
      step_mem->zpred = NULL;
    }
    if (step_mem->zcor != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->zcor);
      step_mem->zcor = NULL;
    }

    /* free the RHS vectors */
    if (step_mem->Fe != NULL)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        arkFreeVec(ark_mem, &step_mem->Fe[j]);
      }
      free(step_mem->Fe);
      step_mem->Fe = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    if (step_mem->Fi != NULL)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        arkFreeVec(ark_mem, &step_mem->Fi[j]);
      }
      free(step_mem->Fi);
      step_mem->Fi = NULL;
      ark_mem->liw -= step_mem->stages;
    }

    /* free stage vectors */
    if (step_mem->z != NULL)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        arkFreeVec(ark_mem, &step_mem->z[j]);
      }
      free(step_mem->z);
      step_mem->z = NULL;
      ark_mem->liw -= step_mem->stages;
    }

    /* free the reusable arrays for fused vector interface */
    if (step_mem->cvals != NULL)
    {
      free(step_mem->cvals);
      step_mem->cvals = NULL;
      ark_mem->lrw -= step_mem->nfusedopvecs;
    }
    if (step_mem->Xvecs != NULL)
    {
      free(step_mem->Xvecs);
      step_mem->Xvecs = NULL;
      ark_mem->liw -= step_mem->nfusedopvecs;
    }
    step_mem->nfusedopvecs = 0;

    /* free work arrays for MRI forcing */
    if (step_mem->stage_times)
    {
      free(step_mem->stage_times);
      step_mem->stage_times = NULL;
      ark_mem->lrw -= step_mem->stages;
    }

    if (step_mem->stage_coefs)
    {
      free(step_mem->stage_coefs);
      step_mem->stage_coefs = NULL;
      ark_mem->lrw -= step_mem->stages;
    }

    /* free the time stepper module itself */
    free(ark_mem->step_mem);
    ark_mem->step_mem = NULL;
  }
}